

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlantUmlGenerator.cpp
# Opt level: O2

void __thiscall
PlantUmlGenerator::generate(PlantUmlGenerator *this,ostream *output,ScName *name,int indentLevel)

{
  ScHistoryMode historyMode;
  pointer pSVar1;
  pointer pSVar2;
  bool bVar3;
  mapped_type *pmVar4;
  ScName *nameAlias;
  ScName *pSVar5;
  ostream *poVar6;
  PlantUmlGenerator *this_00;
  PlantUmlGenerator *pPVar7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  bool isTransitionHighlighted;
  ScRegionNum regionNum;
  long lVar10;
  PlantUmlGenerator *pPVar11;
  pointer name_00;
  type *__range2;
  string indent;
  ScName targetAlias;
  
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState>_>_>
           ::at(&((this->super_AbstractGenerator).m_model)->m_states,name);
  nameAlias = alias(this,name);
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  this_00 = (PlantUmlGenerator *)&indent;
  std::__cxx11::string::_M_construct((ulong)this_00,(char)indentLevel * '\x02');
  if (0 < indentLevel) {
    this_00 = this;
    beginState(this,output,&indent,name,nameAlias);
  }
  historyMode = (pmVar4->historyState).mode;
  if (historyMode != None) {
    this_00 = this;
    pSVar5 = alias(this,&(pmVar4->historyState).initial);
    historyPseudoState(this_00,output,&indent,pSVar5,historyMode);
  }
  pSVar1 = (pmVar4->regions).super__Vector_base<ScRegion,_std::allocator<ScRegion>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar2 = (pmVar4->regions).super__Vector_base<ScRegion,_std::allocator<ScRegion>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar10 = 0; lVar10 != ((long)pSVar1 - (long)pSVar2) / 0x50; lVar10 = lVar10 + 1) {
    if (lVar10 != 0) {
      poVar6 = std::operator<<(output,(string *)&indent);
      std::operator<<(poVar6,"--\n");
    }
    name_00 = (pmVar4->regions).super__Vector_base<ScRegion,_std::allocator<ScRegion>_>._M_impl.
              super__Vector_impl_data._M_start + lVar10;
    poVar6 = std::operator<<(output,(string *)&indent);
    poVar6 = std::operator<<(poVar6,"[*] --> ");
    pSVar5 = alias(this,&name_00->initial);
    this_00 = (PlantUmlGenerator *)std::operator<<(poVar6,(string *)pSVar5);
    std::operator<<((ostream *)this_00,"\n");
    pPVar11 = *(PlantUmlGenerator **)((long)&(name_00->states)._M_t._M_impl + 0x18);
    while (pPVar11 != (PlantUmlGenerator *)((long)&(name_00->states)._M_t._M_impl + 8U)) {
      generate(this,output,
               (ScName *)
               &(pPVar11->super_AbstractGenerator).m_highlightSet._M_t._M_impl.super__Rb_tree_header
                ._M_header._M_parent,indentLevel + 1);
      pPVar7 = (PlantUmlGenerator *)std::_Rb_tree_increment((_Rb_tree_node_base *)pPVar11);
      this_00 = pPVar11;
      pPVar11 = pPVar7;
    }
  }
  if (0 < indentLevel) {
    endState(this_00,output,&indent);
  }
  if ((pmVar4->deferrals)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    poVar6 = std::operator<<(output,(string *)&indent);
    poVar6 = std::operator<<(poVar6,(string *)nameAlias);
    std::operator<<(poVar6," : Deferrals:\n");
    for (p_Var8 = (pmVar4->deferrals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(pmVar4->deferrals)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      deferralLink(this,output,&indent,nameAlias,(ScName *)(p_Var8 + 1));
    }
  }
  for (p_Var8 = (pmVar4->transitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(pmVar4->transitions)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    isTransitionHighlighted = false;
    for (p_Var9 = *(_Rb_tree_node_base **)(p_Var8 + 3);
        p_Var9 != (_Rb_tree_node_base *)&p_Var8[2]._M_left;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      if (p_Var9[1]._M_parent != (_Base_ptr)0x0) {
        bVar3 = ::AbstractGenerator::isHighlighted
                          (&this->super_AbstractGenerator,(ScName *)(p_Var9 + 1));
        isTransitionHighlighted = (bool)(isTransitionHighlighted | bVar3);
      }
    }
    pSVar5 = alias(this,(ScName *)(p_Var8 + 1));
    std::__cxx11::string::string((string *)&targetAlias,(string *)pSVar5);
    if ((p_Var8[2]._M_color + ~_S_black < 2) || (p_Var8[2]._M_color != _S_red)) {
      std::__cxx11::string::append((char *)&targetAlias);
    }
    transitionLink(this,output,&indent,isTransitionHighlighted,nameAlias,&targetAlias,
                   (ScNameSet *)&p_Var8[2]._M_parent);
    std::__cxx11::string::~string((string *)&targetAlias);
  }
  std::__cxx11::string::~string((string *)&indent);
  return;
}

Assistant:

void PlantUmlGenerator::generate(std::ostream &output, const ScName &name, int indentLevel)
{
    const auto &state = m_model.states().at(name);
    const auto &nameAlias = alias(name);

    std::string indent(indentLevel * 2, ' ');

    // Exclude the outerbox with a state machine name:
    if (indentLevel > 0) {
        beginState(output, indent, name, nameAlias);
    }

    // History pseudo-state:
    if (auto historyMode = state.historyState.mode; historyMode != ScHistoryMode::None) {
        historyPseudoState(output, indent, alias(state.historyState.initial), historyMode);
    }

    // Substates:
    const auto totalRegions = state.regions.size();
    for (ScRegionNum regionNum = 0; regionNum < totalRegions; regionNum++) {
        if (regionNum > 0) {
            output << indent << "--\n";
        }

        const auto &substates = state.regions[regionNum];
        output << indent << "[*] --> " << alias(substates.initial) << "\n";
        for (const auto &substateName : substates.states) {
            generate(output, substateName, indentLevel + 1);
        }
    }

    if (indentLevel > 0) {
        endState(output, indent);
    }

    // Deferrals:
    if (!state.deferrals.empty()) {
        output << indent << nameAlias << " : Deferrals:\n";
        for (const auto &eventName : state.deferrals) {
            deferralLink(output, indent, nameAlias, eventName);
        }
    }

    // Transitions:
    for (const auto &[target, eventNames] : state.transitions) {
        bool isTransitionHighlighted = false;
        for (const auto &eventName : eventNames) {
            if (!eventName.empty() && isHighlighted(eventName)) {
                isTransitionHighlighted = true;
            }
        }

        auto targetAlias = alias(target.name);

        // History states in PlantUML can be references as StateName[H] or StateName[H*]:
        if (target.historyMode != ScHistoryMode::None) {
            targetAlias.append(puHistoryState(target.historyMode));
        }

        transitionLink(output, indent, isTransitionHighlighted, nameAlias, targetAlias, eventNames);
    }
}